

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall
QGraphicsView::drawItems
          (QGraphicsView *this,QPainter *painter,int numItems,QGraphicsItem **items,
          QStyleOptionGraphicsItem *options)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  undefined1 *puVar4;
  QWidget *pQVar5;
  QPaintDevice *pQVar6;
  
  lVar1 = *(long *)(this + 8);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
  if (bVar3) {
    puVar4 = (undefined1 *)QPainter::device();
    pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    pQVar6 = &pQVar5->super_QPaintDevice;
    if (pQVar5 == (QWidget *)0x0) {
      pQVar6 = (QPaintDevice *)0x0;
    }
    if ((QPaintDevice *)puVar4 == pQVar6) {
      pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    }
    else {
      pQVar5 = (QWidget *)0x0;
    }
    plVar2 = *(long **)(lVar1 + 0x498);
    (**(code **)(*plVar2 + 0xf8))(plVar2,painter,numItems,items,options,pQVar5);
    return;
  }
  return;
}

Assistant:

void QGraphicsView::drawItems(QPainter *painter, int numItems,
                              QGraphicsItem *items[],
                              const QStyleOptionGraphicsItem options[])
{
    Q_D(QGraphicsView);
    if (d->scene) {
        QWidget *widget = painter->device() == viewport() ? viewport() : nullptr;
        d->scene->drawItems(painter, numItems, items, options, widget);
    }
}